

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glsl.cpp
# Opt level: O0

void sf::priv::copyMatrix(Transform *source,Matrix<3UL,_3UL> *dest)

{
  float *pfVar1;
  float *in_RSI;
  Transform *in_RDI;
  float *to;
  float *from;
  
  pfVar1 = Transform::getMatrix(in_RDI);
  *in_RSI = *pfVar1;
  in_RSI[1] = pfVar1[1];
  in_RSI[2] = pfVar1[3];
  in_RSI[3] = pfVar1[4];
  in_RSI[4] = pfVar1[5];
  in_RSI[5] = pfVar1[7];
  in_RSI[6] = pfVar1[0xc];
  in_RSI[7] = pfVar1[0xd];
  in_RSI[8] = pfVar1[0xf];
  return;
}

Assistant:

void copyMatrix(const Transform& source, Matrix<3, 3>& dest)
    {
        const float* from = source.getMatrix(); // 4x4
        float* to = dest.array;                 // 3x3

        // Use only left-upper 3x3 block (for a 2D transform)
        to[0] = from[ 0]; to[1] = from[ 1]; to[2] = from[ 3];
        to[3] = from[ 4]; to[4] = from[ 5]; to[5] = from[ 7];
        to[6] = from[12]; to[7] = from[13]; to[8] = from[15];
    }